

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dayperiodrules.cpp
# Opt level: O0

DayPeriodRules * icu_63::DayPeriodRules::getInstance(Locale *locale,UErrorCode *errorCode)

{
  UBool UVar1;
  DayPeriod DVar2;
  char *__s;
  size_t sVar3;
  int32_t local_16c;
  char local_168 [4];
  int32_t ruleSetNum;
  char parentName [157];
  char name [157];
  char *localeCode;
  UErrorCode *errorCode_local;
  Locale *locale_local;
  
  umtx_initOnce((UInitOnce *)&(anonymous_namespace)::initOnce,load,errorCode);
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    __s = Locale::getBaseName(locale);
    sVar3 = strlen(__s);
    if (sVar3 < 0x9d) {
      strcpy(parentName + 0x98,__s);
      if (parentName[0x98] == '\0') {
        strcpy(parentName + 0x98,"root");
      }
      local_16c = 0;
      while (((parentName[0x98] != '\0' &&
              (local_16c = uhash_geti_63((UHashtable *)*(anonymous_namespace)::data,
                                         parentName + 0x98), local_16c == 0)) &&
             (uloc_getParent_63(parentName + 0x98,local_168,0x9d,errorCode), local_168[0] != '\0')))
      {
        strcpy(parentName + 0x98,local_168);
      }
      if ((local_16c < 1) ||
         (DVar2 = getDayPeriodForHour((DayPeriodRules *)
                                      ((anonymous_namespace)::data[1] + (long)local_16c * 100),0),
         DVar2 == DAYPERIOD_UNKNOWN)) {
        locale_local = (Locale *)0x0;
      }
      else {
        locale_local = (Locale *)((anonymous_namespace)::data[1] + (long)local_16c * 100);
      }
    }
    else {
      *errorCode = U_BUFFER_OVERFLOW_ERROR;
      locale_local = (Locale *)0x0;
    }
  }
  else {
    locale_local = (Locale *)0x0;
  }
  return (DayPeriodRules *)locale_local;
}

Assistant:

const DayPeriodRules *DayPeriodRules::getInstance(const Locale &locale, UErrorCode &errorCode) {
    umtx_initOnce(initOnce, DayPeriodRules::load, errorCode);

    // If the entire day period rules data doesn't conform to spec (even if the part we want
    // does), return NULL.
    if(U_FAILURE(errorCode)) { return NULL; }

    const char *localeCode = locale.getBaseName();
    char name[ULOC_FULLNAME_CAPACITY];
    char parentName[ULOC_FULLNAME_CAPACITY];

    if (uprv_strlen(localeCode) < ULOC_FULLNAME_CAPACITY) {
        uprv_strcpy(name, localeCode);

        // Treat empty string as root.
        if (*name == '\0') {
            uprv_strcpy(name, "root");
        }
    } else {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return NULL;
    }

    int32_t ruleSetNum = 0;  // NB there is no rule set 0 and 0 is returned upon lookup failure.
    while (*name != '\0') {
        ruleSetNum = uhash_geti(data->localeToRuleSetNumMap, name);
        if (ruleSetNum == 0) {
            // name and parentName can't be the same pointer, so fill in parent then copy to child.
            uloc_getParent(name, parentName, ULOC_FULLNAME_CAPACITY, &errorCode);
            if (*parentName == '\0') {
                // Saves a lookup in the hash table.
                break;
            }
            uprv_strcpy(name, parentName);
        } else {
            break;
        }
    }

    if (ruleSetNum <= 0 || data->rules[ruleSetNum].getDayPeriodForHour(0) == DAYPERIOD_UNKNOWN) {
        // If day period for hour 0 is UNKNOWN then day period for all hours are UNKNOWN.
        // Data doesn't exist even with fallback.
        return NULL;
    } else {
        return &data->rules[ruleSetNum];
    }
}